

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MPEG2.cpp
# Opt level: O2

ostream * ASDCP::MPEG2::operator<<(ostream *strm,VideoDescriptor *VDesc)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(strm,"        SampleRate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->SampleRate).Numerator);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->SampleRate).Denominator);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       FrameLayout: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       StoredWidth: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"      StoredHeight: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       AspectRatio: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->AspectRatio).Numerator);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->AspectRatio).Denominator);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"    ComponentDepth: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm," HorizontalSubsmpl: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"   VerticalSubsmpl: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       ColorSiting: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"  CodedContentType: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"          LowDelay: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"           BitRate: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"   ProfileAndLevel: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm," ContainerDuration: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return strm;
}

Assistant:

std::ostream&
ASDCP::MPEG2::operator << (std::ostream& strm, const VideoDescriptor& VDesc)
{
  strm << "        SampleRate: " << VDesc.SampleRate.Numerator << "/" << VDesc.SampleRate.Denominator << std::endl;
  strm << "       FrameLayout: " << (unsigned) VDesc.FrameLayout << std::endl;
  strm << "       StoredWidth: " << (unsigned) VDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) VDesc.StoredHeight << std::endl;
  strm << "       AspectRatio: " << VDesc.AspectRatio.Numerator << "/" << VDesc.AspectRatio.Denominator << std::endl;
  strm << "    ComponentDepth: " << (unsigned) VDesc.ComponentDepth << std::endl;
  strm << " HorizontalSubsmpl: " << (unsigned) VDesc.HorizontalSubsampling << std::endl;
  strm << "   VerticalSubsmpl: " << (unsigned) VDesc.VerticalSubsampling << std::endl;
  strm << "       ColorSiting: " << (unsigned) VDesc.ColorSiting << std::endl;
  strm << "  CodedContentType: " << (unsigned) VDesc.CodedContentType << std::endl;
  strm << "          LowDelay: " << (unsigned) VDesc.LowDelay << std::endl;
  strm << "           BitRate: " << (unsigned) VDesc.BitRate << std::endl;
  strm << "   ProfileAndLevel: " << (unsigned) VDesc.ProfileAndLevel << std::endl;
  strm << " ContainerDuration: " << (unsigned) VDesc.ContainerDuration << std::endl;

  return strm;
}